

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void tinyxml2::XMLNode::DeleteNode(XMLNode *node)

{
  MemPool *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (node != (XMLNode *)0x0) {
    iVar2 = (*node->_vptr_XMLNode[3])();
    if (CONCAT44(extraout_var,iVar2) == 0) {
      XMLDocument::MarkInUse(node->_document,node);
    }
    pMVar1 = node->_memPool;
    (*node->_vptr_XMLNode[0xf])(node);
    (*pMVar1->_vptr_MemPool[4])(pMVar1,node);
    return;
  }
  return;
}

Assistant:

void XMLNode::DeleteNode( XMLNode* node )
{
    if ( node == 0 ) {
        return;
    }
	TIXMLASSERT(node->_document);
	if (!node->ToDocument()) {
		node->_document->MarkInUse(node);
	}

    MemPool* pool = node->_memPool;
    node->~XMLNode();
    pool->Free( node );
}